

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<double>::apply
          (QGate1<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,int offset
          )

{
  double dVar1;
  double dVar2;
  uint __line;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *__assertion;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int64_t k;
  ulong uVar17;
  int64_t k_1;
  double *pdVar18;
  bool bVar19;
  SquareMatrix<double> mat1;
  SquareMatrix<double> local_50;
  SquareMatrix<double> local_40;
  
  if (nbQubits < 1) {
    __assertion = "nbQubits >= 1";
    __line = 0x1f;
  }
  else {
    bVar5 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar5 & 0x1f))) {
      iVar3 = (*(this->super_QObject<double>)._vptr_QObject[3])();
      if (iVar3 + offset < nbQubits) {
        (*(this->super_QObject<double>)._vptr_QObject[7])(&mat1,this);
        dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,&mat1);
        bVar6 = (byte)(iVar3 + offset);
        if (side == Left) {
          if (nbQubits == 1) {
            dense::SquareMatrix<double>::operator*=(matrix,&mat1);
          }
          else {
            lVar7 = (long)(1 << (~bVar6 + bVar5 & 0x1f));
            lVar10 = matrix->size_;
            uVar9 = 0;
            lVar8 = 0;
            if (0 < lVar7) {
              lVar8 = lVar7;
            }
            uVar4 = (ulong)(uint)(1 << (bVar6 & 0x1f));
            if (1 << (bVar6 & 0x1f) < 1) {
              uVar4 = uVar9;
            }
            lVar11 = 0;
            if (0 < lVar10) {
              lVar11 = lVar10;
            }
            for (lVar14 = 0; lVar14 != lVar11; lVar14 = lVar14 + 1) {
              uVar16 = uVar9;
              for (uVar17 = 0; uVar17 != uVar4; uVar17 = uVar17 + 1) {
                pdVar18 = (matrix->data_)._M_t.
                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl;
                lVar15 = lVar7 * lVar10 * 8 + uVar16;
                lVar12 = lVar8;
                while (bVar19 = lVar12 != 0, lVar12 = lVar12 + -1, bVar19) {
                  dVar1 = *(double *)((long)pdVar18 + uVar16);
                  dVar2 = *(double *)((long)pdVar18 + lVar15);
                  *(double *)((long)pdVar18 + uVar16) =
                       *(double *)
                        mat1.data_._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                       *(double *)
                        ((long)mat1.data_._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) * dVar2;
                  *(double *)((long)pdVar18 + lVar15) =
                       dVar1 * *(double *)
                                ((long)mat1.data_._M_t.
                                       super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                       .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                mat1.size_ * 8) +
                       dVar2 * *(double *)
                                ((long)mat1.data_._M_t.
                                       super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                       .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8 +
                                mat1.size_ * 8);
                  pdVar18 = pdVar18 + lVar10;
                }
                uVar16 = uVar16 + lVar7 * lVar10 * 0x10;
              }
              uVar9 = uVar9 + 8;
            }
          }
        }
        else if (nbQubits == 1) {
          dense::SquareMatrix<double>::SquareMatrix(&local_50,&mat1);
          dense::operator*((dense *)&local_40,&local_50,matrix);
          dense::SquareMatrix<double>::operator=(matrix,&local_40);
          std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_40.data_);
          std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_50.data_);
        }
        else {
          lVar8 = (long)(1 << (~bVar6 + bVar5 & 0x1f));
          uVar9 = 0;
          lVar10 = 0;
          if (0 < lVar8) {
            lVar10 = lVar8;
          }
          lVar7 = matrix->size_;
          uVar4 = (ulong)(uint)(1 << (bVar6 & 0x1f));
          if (1 << (bVar6 & 0x1f) < 1) {
            uVar4 = uVar9;
          }
          lVar11 = 0;
          if (0 < lVar7) {
            lVar11 = lVar7;
          }
          lVar14 = lVar8 * 8;
          for (lVar15 = 0; lVar15 != lVar11; lVar15 = lVar15 + 1) {
            uVar16 = uVar9;
            lVar12 = lVar14;
            for (uVar17 = 0; uVar17 != uVar4; uVar17 = uVar17 + 1) {
              pdVar18 = (matrix->data_)._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl;
              for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
                dVar1 = *(double *)((long)pdVar18 + lVar13 * 8 + uVar16);
                dVar2 = *(double *)((long)pdVar18 + lVar13 * 8 + lVar12);
                *(double *)((long)pdVar18 + lVar13 * 8 + uVar16) =
                     *(double *)
                      mat1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                      super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                     *(double *)
                      ((long)mat1.data_._M_t.
                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                             super__Head_base<0UL,_double_*,_false>._M_head_impl + mat1.size_ * 8) *
                     dVar2;
                *(double *)((long)pdVar18 + lVar13 * 8 + lVar12) =
                     dVar1 * *(double *)
                              ((long)mat1.data_._M_t.
                                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                     .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) +
                     dVar2 * *(double *)
                              ((long)mat1.data_._M_t.
                                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                     .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8 +
                              mat1.size_ * 8);
              }
              lVar12 = lVar12 + lVar8 * 0x10;
              uVar16 = uVar16 + lVar8 * 0x10;
            }
            lVar14 = lVar14 + lVar7 * 8;
            uVar9 = uVar9 + lVar7 * 8;
          }
        }
        std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&mat1.data_);
        return;
      }
      __assertion = "qubit < nbQubits";
      __line = 0x22;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x20;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }